

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RenameColumn
          (DuckTableEntry *this,ClientContext *context,RenameColumnInfo *info)

{
  __node_base *__ht;
  ForeignKeyType FVar1;
  SchemaCatalogEntry *pSVar2;
  pointer pbVar3;
  size_t sVar4;
  Catalog *catalog;
  pointer pcVar5;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var6;
  __node_base this_00;
  bool bVar7;
  int iVar8;
  CreateTableInfo *this_01;
  pointer pCVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  ColumnDefinition *this_03;
  LogicalIndex LVar10;
  ParsedExpression *expr;
  reference this_04;
  pointer pCVar11;
  CheckConstraint *pCVar12;
  type expr_00;
  UniqueConstraint *this_05;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar13;
  ForeignKeyConstraint *pFVar14;
  reference pvVar15;
  Binder *info_00;
  type info_01;
  DuckTableEntry *this_06;
  InternalException *this_07;
  CatalogException *pCVar16;
  __atomic_base<unsigned_long> in_RCX;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_name;
  pointer pbVar17;
  size_type sVar18;
  ClientContext *pCVar19;
  ColumnListIterator CVar20;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  templated_unique_single_t create_info;
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnDefinition copy;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  ClientContext *local_280;
  __node_base local_278;
  ClientContext *local_270;
  __node_base local_268;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_260;
  undefined1 local_258 [24];
  __node_base local_240;
  _Alloc_hider local_238;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  string *local_218;
  atomic<unsigned_long> local_210;
  __node_base local_208;
  undefined1 local_200 [88];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_1a8;
  Value local_1a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_160 [56];
  undefined1 local_128 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  LogicalType local_e8;
  pointer puStack_d0;
  undefined8 uStack_bf;
  element_type *local_b0;
  Value local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_68 [56];
  
  local_238._M_p = (pointer)(in_RCX._M_i + 0x78);
  local_230._M_head_impl = (CatalogEntry *)this;
  local_228._M_allocated_capacity = (size_type)info;
  local_268._M_nxt =
       (_Hash_node_base *)
       TableCatalogEntry::GetColumnIndex
                 ((TableCatalogEntry *)context,(string *)local_238._M_p,false);
  if (local_268._M_nxt == (_Hash_node_base *)0xffffffffffffffff) {
    pCVar16 = (CatalogException *)__cxa_allocate_exception(0x10);
    local_200._0_8_ = local_200 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Cannot rename rowid column","");
    CatalogException::CatalogException(pCVar16,(string *)local_200);
    __cxa_throw(pCVar16,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  this_01 = (CreateTableInfo *)operator_new(0x1d8);
  local_200._0_8_ = local_200 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,*(long *)&context->interrupted,
             (long)&(((context->registered_state).
                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                    ->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
  CreateTableInfo::CreateTableInfo(this_01,pSVar2,(string *)local_200);
  local_2a0._8_8_ = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_200 + 0x10)) {
    operator_delete((void *)local_200._0_8_);
  }
  bVar7 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)(local_2a0 + 8));
  (pCVar9->super_CreateInfo).temporary = bVar7;
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)(local_2a0 + 8));
  Value::operator=(&(pCVar9->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)(local_2a0 + 8));
  __ht = &(context->config).profiler_settings._M_h._M_before_begin;
  this_02 = &(pCVar9->super_CreateInfo).tags;
  if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)__ht != this_02) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_02,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)__ht);
  }
  CVar20 = ColumnList::Logical((ColumnList *)&(context->config).asof_loop_join_threshold);
  local_290._0_8_ = CVar20.list;
  local_290[8] = CVar20.physical;
  if (((undefined1  [16])CVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_278._M_nxt =
         (_Hash_node_base *)
         (((long)(((vector<duckdb::ColumnDefinition,_true> *)
                  &((element_type *)local_290._0_8_)->super_enable_shared_from_this<duckdb::Binder>)
                 ->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ).
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(((vector<duckdb::ColumnDefinition,_true> *)
                  &((element_type *)local_290._0_8_)->super_enable_shared_from_this<duckdb::Binder>)
                 ->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ).
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
  }
  else {
    local_278._M_nxt =
         (_Hash_node_base *)
         ((long)(((element_type *)local_290._0_8_)->bound_ctes)._M_h._M_bucket_count -
          (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &(((element_type *)local_290._0_8_)->bound_ctes)._M_h._M_buckets)->_M_impl).
                super__Vector_impl_data._M_start >> 3);
  }
  local_280 = (ClientContext *)0x0;
  if (((undefined1  [16])CVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_258._16_8_ =
         ((long)(((vector<duckdb::ColumnDefinition,_true> *)
                 &((element_type *)local_290._0_8_)->super_enable_shared_from_this<duckdb::Binder>)
                ->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                .
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(((vector<duckdb::ColumnDefinition,_true> *)
                 &((element_type *)local_290._0_8_)->super_enable_shared_from_this<duckdb::Binder>)
                ->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                .
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    local_258._16_8_ =
         (long)(((element_type *)local_290._0_8_)->bound_ctes)._M_h._M_bucket_count -
         (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                &(((element_type *)local_290._0_8_)->bound_ctes)._M_h._M_buckets)->_M_impl).
               super__Vector_impl_data._M_start >> 3;
  }
  if (((undefined1  [16])CVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_258._8_8_ =
         ((long)(((vector<duckdb::ColumnDefinition,_true> *)
                 &((element_type *)local_290._0_8_)->super_enable_shared_from_this<duckdb::Binder>)
                ->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                .
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(((vector<duckdb::ColumnDefinition,_true> *)
                 &((element_type *)local_290._0_8_)->super_enable_shared_from_this<duckdb::Binder>)
                ->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                .
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    local_258._8_8_ =
         (long)(((element_type *)local_290._0_8_)->bound_ctes)._M_h._M_bucket_count -
         (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                &(((element_type *)local_290._0_8_)->bound_ctes)._M_h._M_buckets)->_M_impl).
               super__Vector_impl_data._M_start >> 3;
  }
  local_270 = context;
  local_240._M_nxt = (_Hash_node_base *)local_290._0_8_;
  if (((ClientContext *)local_258._16_8_ != (ClientContext *)0x0) ||
     (local_278._M_nxt != (_Hash_node_base *)local_258._8_8_)) {
    local_218 = (string *)(in_RCX._M_i + 0x98);
    local_228._8_8_ = &(context->config).user_variables._M_h._M_element_count;
    local_208._M_nxt = (_Hash_node_base *)a_Stack_68;
    local_260 = a_Stack_160;
    local_210.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)in_RCX._M_i;
    do {
      this_03 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                          ((ColumnLogicalIteratorInternal *)local_290);
      ColumnDefinition::Copy((ColumnDefinition *)local_200,this_03);
      LVar10 = ColumnDefinition::Logical(this_03);
      if (local_268._M_nxt == (_Hash_node_base *)LVar10.index) {
        ColumnDefinition::SetName((ColumnDefinition *)local_200,local_218);
      }
      bVar7 = ColumnDefinition::Generated(this_03);
      if (bVar7) {
        LVar10 = ColumnDefinition::Logical(this_03);
        bVar7 = ColumnDependencyManager::IsDependencyOf
                          ((ColumnDependencyManager *)local_228._8_8_,LVar10,
                           (LogicalIndex)local_268._M_nxt);
        if (bVar7) {
          expr = ColumnDefinition::GeneratedExpressionMutable((ColumnDefinition *)local_200);
          RenameExpression(expr,(RenameColumnInfo *)in_RCX._M_i);
        }
      }
      pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)(local_2a0 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_200 + 0x10)) {
        local_f8._8_8_ = local_200._24_8_;
        local_108._M_allocated_capacity = (size_type)&local_f8;
      }
      else {
        local_108._M_allocated_capacity = local_200._0_8_;
      }
      local_f8._M_allocated_capacity._1_7_ = local_200._17_7_;
      local_f8._M_local_buf[0] = local_200[0x10];
      local_108._8_8_ = local_200._8_8_;
      local_200._8_8_ = (_Hash_node_base *)0x0;
      local_200[0x10] = '\0';
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_200 + 0x10);
      LogicalType::LogicalType(&local_e8,(LogicalType *)(local_200 + 0x20));
      uStack_bf = local_200._73_8_;
      puStack_d0 = (pointer)local_200._56_8_;
      local_b0 = (element_type *)local_1a8._M_head_impl;
      local_1a8._M_head_impl = (ParsedExpression *)0x0;
      Value::Value(&local_a8,&local_1a0);
      this_00._M_nxt = local_208._M_nxt;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_208._M_nxt,local_260);
      ColumnList::AddColumn(&pCVar9->columns,(ColumnDefinition *)&local_108);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)this_00._M_nxt);
      Value::~Value(&local_a8);
      if (local_b0 != (element_type *)0x0) {
        (*((BaseExpression *)&local_b0->super_enable_shared_from_this<duckdb::Binder>)->
          _vptr_BaseExpression[1])();
      }
      local_b0 = (element_type *)0x0;
      LogicalType::~LogicalType(&local_e8);
      in_RCX = local_210.super___atomic_base<unsigned_long>._M_i;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_allocated_capacity != &local_f8) {
        operator_delete((void *)local_108._M_allocated_capacity);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_260);
      Value::~Value(&local_1a0);
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_1a8._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_1a8._M_head_impl + 8))();
      }
      local_1a8._M_head_impl = (ParsedExpression *)0x0;
      LogicalType::~LogicalType((LogicalType *)(local_200 + 0x20));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_);
      }
      local_280 = (ClientContext *)
                  ((long)&(local_280->super_enable_shared_from_this<duckdb::ClientContext>).
                          __weak_this_.internal.
                          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  + 1);
    } while (((local_280 != (ClientContext *)local_258._16_8_) ||
             (local_278._M_nxt != (_Hash_node_base *)local_258._8_8_)) ||
            ((_Hash_node_base *)local_290._0_8_ != local_240._M_nxt));
  }
  pCVar19 = local_270;
  if ((local_270->config).set_variables._M_h._M_single_bucket !=
      (__node_base_ptr)(local_270->config).set_variables._M_h._M_rehash_policy._M_next_resize) {
    local_268._M_nxt =
         (_Hash_node_base *)&(local_270->config).set_variables._M_h._M_rehash_policy._M_next_resize;
    local_260 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(in_RCX._M_i + 0x98);
    __n = 0;
    do {
      this_04 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                              *)local_268._M_nxt,__n);
      pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_04);
      (*pCVar11->_vptr_Constraint[3])(local_2a0,pCVar11);
      pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                            *)local_2a0);
      switch(pCVar11->type) {
      case NOT_NULL:
        break;
      case CHECK:
        pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                              *)local_2a0);
        pCVar12 = Constraint::Cast<duckdb::CheckConstraint>(pCVar11);
        expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(&pCVar12->expression);
        RenameExpression(expr_00,(RenameColumnInfo *)in_RCX._M_i);
        break;
      case UNIQUE:
        pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                              *)local_2a0);
        this_05 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar11);
        pvVar13 = UniqueConstraint::GetColumnNamesMutable_abi_cxx11_(this_05);
        pbVar3 = (pvVar13->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar17 = (pvVar13->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar3;
            pbVar17 = pbVar17 + 1) {
          sVar4 = pbVar17->_M_string_length;
          if ((sVar4 == *(size_type *)(in_RCX._M_i + 0x80)) &&
             ((sVar4 == 0 ||
              (iVar8 = bcmp((pbVar17->_M_dataplus)._M_p,*(void **)local_238._M_p,sVar4), iVar8 == 0)
              ))) {
            ::std::__cxx11::string::_M_assign((string *)pbVar17);
          }
        }
        break;
      case FOREIGN_KEY:
        pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                              *)local_2a0);
        pFVar14 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar11);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,
                 &(pFVar14->pk_columns).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        FVar1 = (pFVar14->info).type;
        if (FVar1 == FK_TYPE_FOREIGN_KEY_TABLE) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_290,
                      &(pFVar14->fk_columns).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
        }
        else if ((FVar1 == FK_TYPE_SELF_REFERENCE_TABLE) &&
                ((pFVar14->fk_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 (pFVar14->fk_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)) {
          sVar18 = 0;
          do {
            pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&pFVar14->fk_columns,sVar18);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_290,pvVar15);
            sVar18 = sVar18 + 1;
          } while (sVar18 < (ulong)((long)(pFVar14->fk_columns).
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pFVar14->fk_columns).
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        if ((element_type *)CONCAT71(local_290._9_7_,local_290[8]) !=
            (element_type *)local_290._0_8_) {
          sVar18 = 0;
          do {
            pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)local_290,sVar18);
            sVar4 = pvVar15->_M_string_length;
            if ((sVar4 == *(size_type *)(in_RCX._M_i + 0x80)) &&
               ((sVar4 == 0 ||
                (iVar8 = bcmp((pvVar15->_M_dataplus)._M_p,*(void **)local_238._M_p,sVar4),
                iVar8 == 0)))) {
              pCVar16 = (CatalogException *)__cxa_allocate_exception(0x10);
              local_200._0_8_ = local_200 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_200,
                         "Cannot rename column \"%s\" because this is involved in the foreign key constraint"
                         ,"");
              local_128._0_8_ = local_128 + 0x10;
              pcVar5 = (((string *)(in_RCX._M_i + 0x78))->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_128,pcVar5,pcVar5 + *(size_type *)(in_RCX._M_i + 0x80));
              CatalogException::CatalogException<std::__cxx11::string>
                        (pCVar16,(string *)local_200,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
              __cxa_throw(pCVar16,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
            }
            sVar18 = sVar18 + 1;
          } while (sVar18 < (ulong)(CONCAT71(local_290._9_7_,local_290[8]) - local_290._0_8_ >> 5));
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_290);
        break;
      default:
        this_07 = (InternalException *)__cxa_allocate_exception(0x10);
        local_200._0_8_ = local_200 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_200,"Unsupported constraint for entry!","");
        InternalException::InternalException(this_07,(string *)local_200);
        __cxa_throw(this_07,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)(local_2a0 + 8));
      pCVar19 = local_270;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar9->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_2a0);
      if ((Constraint *)local_2a0._0_8_ != (Constraint *)0x0) {
        (**(code **)(*(long *)local_2a0._0_8_ + 8))();
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)((long)(pCVar19->config).set_variables._M_h._M_single_bucket -
                                 (pCVar19->config).set_variables._M_h._M_rehash_policy.
                                 _M_next_resize) >> 3));
  }
  Binder::CreateBinder
            ((Binder *)local_290,(ClientContext *)local_228._M_allocated_capacity,
             (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_290);
  local_258._0_8_ = local_2a0._8_8_;
  local_2a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_2a0,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             info_00,(SchemaCatalogEntry *)local_258);
  if ((CreateTableInfo *)local_258._0_8_ != (CreateTableInfo *)0x0) {
    (*(((CreateInfo *)local_258._0_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_258._0_8_ = (__node_base_ptr)0x0;
  catalog = (Catalog *)(pCVar19->config).max_expression_depth;
  pSVar2 = *(SchemaCatalogEntry **)&(pCVar19->config).query_verification_enabled;
  info_01 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                         *)local_2a0);
  this_06 = (DuckTableEntry *)operator_new(0x298);
  local_200._0_8_ = (local_270->config).user_variables._M_h._M_bucket_count;
  local_200._8_8_ = (local_270->config).user_variables._M_h._M_before_begin._M_nxt;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_)->_M_use_count + 1;
    }
  }
  DuckTableEntry(this_06,catalog,pSVar2,info_01,(shared_ptr<duckdb::DataTable,_true> *)local_200);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  _Var6._M_head_impl = local_230._M_head_impl;
  (local_230._M_head_impl)->_vptr_CatalogEntry = (_func_int **)this_06;
  if ((tuple<duckdb::Constraint_*,_std::default_delete<duckdb::Constraint>_>)local_2a0._0_8_ !=
      (_Head_base<0UL,_duckdb::Constraint_*,_false>)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)local_2a0,
               (BoundCreateTableInfo *)local_2a0._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_290._9_7_,local_290[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_290._9_7_,local_290[8]));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_2a0._8_8_)[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         _Var6._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RenameColumn(ClientContext &context, RenameColumnInfo &info) {
	auto rename_idx = GetColumnIndex(info.old_name);
	if (rename_idx.index == COLUMN_IDENTIFIER_ROW_ID) {
		throw CatalogException("Cannot rename rowid column");
	}
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;
	for (auto &col : columns.Logical()) {
		auto copy = col.Copy();
		if (rename_idx == col.Logical()) {
			copy.SetName(info.new_name);
		}
		if (col.Generated() && column_dependency_manager.IsDependencyOf(col.Logical(), rename_idx)) {
			RenameExpression(copy.GeneratedExpressionMutable(), info);
		}
		create_info->columns.AddColumn(std::move(copy));
	}
	for (idx_t c_idx = 0; c_idx < constraints.size(); c_idx++) {
		auto copy = constraints[c_idx]->Copy();
		switch (copy->type) {
		case ConstraintType::NOT_NULL:
			// NOT NULL constraint: no adjustments necessary
			break;
		case ConstraintType::CHECK: {
			// CHECK constraint: need to rename column references that refer to the renamed column
			auto &check = copy->Cast<CheckConstraint>();
			RenameExpression(*check.expression, info);
			break;
		}
		case ConstraintType::UNIQUE: {
			// UNIQUE constraint: possibly need to rename columns
			auto &unique = copy->Cast<UniqueConstraint>();
			for (auto &column_name : unique.GetColumnNamesMutable()) {
				if (column_name == info.old_name) {
					column_name = info.new_name;
				}
			}
			break;
		}
		case ConstraintType::FOREIGN_KEY: {
			// FOREIGN KEY constraint: possibly need to rename columns
			auto &fk = copy->Cast<ForeignKeyConstraint>();
			vector<string> columns = fk.pk_columns;
			if (fk.info.type == ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE) {
				columns = fk.fk_columns;
			} else if (fk.info.type == ForeignKeyType::FK_TYPE_SELF_REFERENCE_TABLE) {
				for (idx_t i = 0; i < fk.fk_columns.size(); i++) {
					columns.push_back(fk.fk_columns[i]);
				}
			}
			for (idx_t i = 0; i < columns.size(); i++) {
				if (columns[i] == info.old_name) {
					throw CatalogException(
					    "Cannot rename column \"%s\" because this is involved in the foreign key constraint",
					    info.old_name);
				}
			}
			break;
		}
		default:
			throw InternalException("Unsupported constraint for entry!");
		}
		create_info->constraints.push_back(std::move(copy));
	}
	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}